

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O2

void __thiscall
wallet::COutput::COutput
          (COutput *this,COutPoint *outpoint,CTxOut *txout,int depth,int input_bytes,bool spendable,
          bool solvable,bool safe,int64_t time,bool from_me,CAmount fees)

{
  long lVar1;
  long lVar2;
  optional<CFeeRate> feerate;
  long *plVar3;
  long in_FS_OFFSET;
  _Storage<CFeeRate,_true> local_38;
  uint7 uStack_2f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = (ulong)uStack_2f << 8;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = local_38;
  COutput(this,outpoint,txout,depth,input_bytes,spendable,solvable,safe,time,from_me,feerate);
  if ((-1 < input_bytes || fees != 0) && ((input_bytes < 1 || (fees < 0)))) {
    __assert_fail("(input_bytes < 0 && fees == 0) || (input_bytes > 0 && fees >= 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
                  ,100,
                  "wallet::COutput::COutput(const COutPoint &, const CTxOut &, int, int, bool, bool, bool, int64_t, bool, const CAmount)"
                 );
  }
  (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = fees;
  (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = true;
  lVar2 = txout->nValue;
  plVar3 = std::optional<long>::value(&this->fee);
  (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = lVar2 - *plVar3;
  (this->effective_value).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

COutput(const COutPoint& outpoint, const CTxOut& txout, int depth, int input_bytes, bool spendable, bool solvable, bool safe, int64_t time, bool from_me, const CAmount fees)
        : COutput(outpoint, txout, depth, input_bytes, spendable, solvable, safe, time, from_me)
    {
        // if input_bytes is unknown, then fees should be 0, if input_bytes is known, then the fees should be a positive integer or 0 (input_bytes known and fees = 0 only happens in the tests)
        assert((input_bytes < 0 && fees == 0) || (input_bytes > 0 && fees >= 0));
        fee = fees;
        effective_value = txout.nValue - fee.value();
    }